

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O1

uint32_t * pack25_32(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 - base;
  *out = (in[1] - base) * 0x2000000 | uVar1 - base;
  uVar2 = in[1] - base >> 7;
  out[1] = uVar2;
  out[1] = (in[2] - base) * 0x40000 | uVar2;
  uVar2 = in[2] - base >> 0xe;
  out[2] = uVar2;
  out[2] = (in[3] - base) * 0x800 | uVar2;
  uVar2 = in[3] - base >> 0x15;
  out[3] = uVar2;
  uVar2 = (in[4] - base) * 0x10 | uVar2;
  out[3] = uVar2;
  out[3] = (in[5] - base) * 0x20000000 | uVar2;
  uVar2 = in[5] - base >> 3;
  out[4] = uVar2;
  out[4] = (in[6] - base) * 0x400000 | uVar2;
  uVar2 = in[6] - base >> 10;
  out[5] = uVar2;
  out[5] = (in[7] - base) * 0x8000 | uVar2;
  uVar2 = in[7] - base >> 0x11;
  out[6] = uVar2;
  out[6] = (in[8] - base) * 0x100 | uVar2;
  uVar2 = in[8] - base >> 0x18;
  out[7] = uVar2;
  uVar2 = (in[9] - base) * 2 | uVar2;
  out[7] = uVar2;
  out[7] = (in[10] - base) * 0x4000000 | uVar2;
  uVar2 = in[10] - base >> 6;
  out[8] = uVar2;
  out[8] = (in[0xb] - base) * 0x80000 | uVar2;
  uVar2 = in[0xb] - base >> 0xd;
  out[9] = uVar2;
  out[9] = (in[0xc] - base) * 0x1000 | uVar2;
  uVar2 = in[0xc] - base >> 0x14;
  out[10] = uVar2;
  uVar2 = (in[0xd] - base) * 0x20 | uVar2;
  out[10] = uVar2;
  out[10] = (in[0xe] - base) * 0x40000000 | uVar2;
  uVar2 = in[0xe] - base >> 2;
  out[0xb] = uVar2;
  out[0xb] = (in[0xf] - base) * 0x800000 | uVar2;
  uVar2 = in[0xf] - base >> 9;
  out[0xc] = uVar2;
  out[0xc] = (in[0x10] - base) * 0x10000 | uVar2;
  uVar2 = in[0x10] - base >> 0x10;
  out[0xd] = uVar2;
  out[0xd] = (in[0x11] - base) * 0x200 | uVar2;
  uVar2 = in[0x11] - base >> 0x17;
  out[0xe] = uVar2;
  uVar2 = (in[0x12] - base) * 4 | uVar2;
  out[0xe] = uVar2;
  out[0xe] = (in[0x13] - base) * 0x8000000 | uVar2;
  uVar2 = in[0x13] - base >> 5;
  out[0xf] = uVar2;
  out[0xf] = (in[0x14] - base) * 0x100000 | uVar2;
  uVar2 = in[0x14] - base >> 0xc;
  out[0x10] = uVar2;
  out[0x10] = (in[0x15] - base) * 0x2000 | uVar2;
  uVar2 = in[0x15] - base >> 0x13;
  out[0x11] = uVar2;
  uVar2 = (in[0x16] - base) * 0x40 | uVar2;
  out[0x11] = uVar2;
  out[0x11] = (in[0x17] - base) * -0x80000000 | uVar2;
  uVar2 = in[0x17] - base >> 1;
  out[0x12] = uVar2;
  out[0x12] = (in[0x18] - base) * 0x1000000 | uVar2;
  uVar2 = in[0x18] - base >> 8;
  out[0x13] = uVar2;
  out[0x13] = (in[0x19] - base) * 0x20000 | uVar2;
  uVar2 = in[0x19] - base >> 0xf;
  out[0x14] = uVar2;
  out[0x14] = (in[0x1a] - base) * 0x400 | uVar2;
  uVar2 = in[0x1a] - base >> 0x16;
  out[0x15] = uVar2;
  uVar2 = (in[0x1b] - base) * 8 | uVar2;
  out[0x15] = uVar2;
  out[0x15] = (in[0x1c] - base) * 0x10000000 | uVar2;
  uVar2 = in[0x1c] - base >> 4;
  out[0x16] = uVar2;
  out[0x16] = (in[0x1d] - base) * 0x200000 | uVar2;
  uVar2 = in[0x1d] - base >> 0xb;
  out[0x17] = uVar2;
  out[0x17] = (in[0x1e] - base) * 0x4000 | uVar2;
  uVar2 = in[0x1e] - base >> 0x12;
  out[0x18] = uVar2;
  out[0x18] = (in[0x1f] - base) * 0x80 | uVar2;
  return out + 0x19;
}

Assistant:

uint32_t * pack25_32( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  25 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  18 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  18 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  11 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  11 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  4 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  4 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  29 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  22 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  22 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  15 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  15 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  8 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  1 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  1 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  26 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  19 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  19 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  12 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  12 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  5 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  5 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  30 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  23 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  23 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  16 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  16 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  9 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  9 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  2 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  2 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  27 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  20 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  20 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  13 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  13 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  6 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  6 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  31 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  24 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  17 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  17 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  10 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  10 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  3 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  3 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  28 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  21 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  21 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  14 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  14 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  7 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  7 ;
    ++out;
    ++in;

    return out;
}